

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Signature> *
wasm::WATParser::functype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<wasm::Signature> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  bool bVar1;
  _Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
  *params;
  _Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
  *results;
  string_view expected;
  SignatureT SVar2;
  undefined1 local_e8 [8];
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> parsedParams;
  string local_a0 [32];
  undefined1 local_80 [8];
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> parsedResults;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> _val_1;
  
  this = &ctx->in;
  expected._M_str = "func";
  expected._M_len = 4;
  bVar1 = Lexer::takeSExprStart(this,expected);
  if (bVar1) {
    params<wasm::WATParser::ParseTypeDefsCtx>
              ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               local_e8,ctx,true);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)local_80,
                      (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)local_e8);
    if (parsedResults.val.
        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_ ==
        '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&parsedResults.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20),(string *)local_80);
      std::__detail::__variant::_Variant_storage<false,wasm::Signature,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Signature,wasm::None,wasm::Err> *)
                 __return_storage_ptr__,
                 (__index_type *)
                 ((long)&parsedResults.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&parsedResults.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           *)local_80);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           *)local_80);
      results<wasm::WATParser::ParseTypeDefsCtx>
                ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)local_80,ctx)
      ;
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)((long)&parsedResults.val.
                                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           + 0x20),
                        (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)local_80);
      if (_val_1.val.
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_
          == '\x02') {
        std::__cxx11::string::string
                  (local_a0,(string *)
                            ((long)&parsedResults.val.
                                    super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                            + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Signature,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Signature,wasm::None,wasm::Err> *)
                   __return_storage_ptr__,local_a0);
        std::__cxx11::string::~string(local_a0);
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             *)((long)&parsedResults.val.
                                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               + 0x20));
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             *)((long)&parsedResults.val.
                                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                               + 0x20));
        bVar1 = Lexer::takeRParen(this);
        if (bVar1) {
          params = (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                    *)local_e8;
          if (parsedParams.val.
              super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
              .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._M_u.
              _24_1_ != '\0') {
            params = (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                      *)0x0;
          }
          results = (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                     *)local_80;
          if (parsedResults.val.
              super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
              .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u.
              _24_1_ != '\0') {
            results = (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)0x0;
          }
          SVar2 = TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeFuncType
                            (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,
                             (ParamsT *)params,(ResultsT *)results);
          *(SignatureT *)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> = SVar2;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x20) =
               '\0';
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     ((long)&parsedParams.val.
                             super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                     + 0x20),"expected end of functype",(allocator<char> *)local_a0);
          Lexer::err((Err *)((long)&parsedResults.val.
                                    super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                            + 0x20),this,
                     (string *)
                     ((long)&parsedParams.val.
                             super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                     + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Signature,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Signature,wasm::None,wasm::Err> *)
                     __return_storage_ptr__,
                     (__index_type *)
                     ((long)&parsedResults.val.
                             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             .super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                     + 0x20));
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&parsedResults.val.
                             super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             .super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             .super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                     + 0x20));
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&parsedParams.val.
                             super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                     + 0x20));
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           *)local_80);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                         *)local_e8);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::SignatureT> functype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("func"sv)) {
    return {};
  }

  auto parsedParams = params(ctx);
  CHECK_ERR(parsedParams);

  auto parsedResults = results(ctx);
  CHECK_ERR(parsedResults);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of functype");
  }

  return ctx.makeFuncType(parsedParams.getPtr(), parsedResults.getPtr());
}